

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrs.h
# Opt level: O0

void Psr_NtkFree(Psr_Ntk_t *p)

{
  Psr_Ntk_t *p_local;
  
  if (p->pStrs != (Abc_Nam_t *)0x0) {
    Abc_NamDeref(p->pStrs);
  }
  Vec_IntErase(&p->vOrder);
  Vec_IntErase(&p->vInouts);
  Vec_IntErase(&p->vInputs);
  Vec_IntErase(&p->vOutputs);
  Vec_IntErase(&p->vWires);
  Vec_IntErase(&p->vInoutsR);
  Vec_IntErase(&p->vInputsR);
  Vec_IntErase(&p->vOutputsR);
  Vec_IntErase(&p->vWiresR);
  Vec_IntErase(&p->vSlices);
  Vec_IntErase(&p->vConcats);
  Vec_IntErase(&p->vBoxes);
  Vec_IntErase(&p->vObjs);
  if (p != (Psr_Ntk_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

static inline void Psr_NtkFree( Psr_Ntk_t * p )
{
    if ( p->pStrs )
        Abc_NamDeref( p->pStrs );
    Vec_IntErase( &p->vOrder );
    Vec_IntErase( &p->vInouts );
    Vec_IntErase( &p->vInputs );
    Vec_IntErase( &p->vOutputs );
    Vec_IntErase( &p->vWires );
    Vec_IntErase( &p->vInoutsR );
    Vec_IntErase( &p->vInputsR );
    Vec_IntErase( &p->vOutputsR );
    Vec_IntErase( &p->vWiresR );
    Vec_IntErase( &p->vSlices );
    Vec_IntErase( &p->vConcats );
    Vec_IntErase( &p->vBoxes );
    Vec_IntErase( &p->vObjs );
    ABC_FREE( p );
}